

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O0

int ms5837_conversion_and_read_adc(MS5837 *pMS5837,uint8_t cmd,uint32_t *adc)

{
  int iVar1;
  byte local_2b;
  byte local_2a;
  byte local_29;
  int recvbuflen;
  uchar recvbuf [3];
  uint32_t *adc_local;
  uint8_t cmd_local;
  MS5837 *pMS5837_local;
  
  _recvbuflen = adc;
  iVar1 = ms5837_write_command(pMS5837,cmd);
  if (iVar1 == 0) {
    mSleep((ulong)pMS5837->conversion_time[(int)((cmd & 0xf) / 2)] / 1000);
    iVar1 = ms5837_write_command(pMS5837,'\0');
    if (iVar1 == 0) {
      memset(&local_2b,0,3);
      iVar1 = ReadAllI2CBus(&pMS5837->I2CBus,&local_2b,3);
      if (iVar1 == 0) {
        if ((pMS5837->bSaveRawData != 0) && (pMS5837->pfSaveFile != (FILE *)0x0)) {
          fwrite(&local_2b,3,1,(FILE *)pMS5837->pfSaveFile);
          fflush((FILE *)pMS5837->pfSaveFile);
        }
        *_recvbuflen = (uint)local_2b << 0x10 | (uint)local_2a << 8 | (uint)local_29;
        pMS5837_local._4_4_ = 0;
      }
      else {
        pMS5837_local._4_4_ = 1;
      }
    }
    else {
      pMS5837_local._4_4_ = 1;
    }
  }
  else {
    pMS5837_local._4_4_ = 1;
  }
  return pMS5837_local._4_4_;
}

Assistant:

inline int ms5837_conversion_and_read_adc(MS5837* pMS5837, uint8_t cmd, uint32_t *adc)
{
	unsigned char recvbuf[3];
	int recvbuflen = 0;

	if (ms5837_write_command(pMS5837, cmd) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// delay conversion depending on resolution
	mSleep(pMS5837->conversion_time[ (cmd & MS5837_CONVERSION_OSR_MASK)/2 ]/1000 );
	
	// Send the read command
	if (ms5837_write_command(pMS5837, MS5837_READ_ADC) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 3;

	if (ReadAllI2CBus(&pMS5837->I2CBus, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pMS5837->bSaveRawData)&&(pMS5837->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pMS5837->pfSaveFile);
		fflush(pMS5837->pfSaveFile);
	}

	*adc = ((uint32_t)recvbuf[0] << 16) | ((uint32_t)recvbuf[1] << 8) | recvbuf[2];
	
	return EXIT_SUCCESS;
}